

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_ssub_u16(c_v256 a,c_v256 b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  c_v256 cVar9;
  c_v256 *in_RDI;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = a.u64[2];
  auVar1 = vpmovzxwd_avx(auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[3];
  auVar2 = vpmovzxwd_avx(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = b.u64[2];
  auVar3 = vpmovzxwd_avx(auVar3);
  auVar8 = vpsubd_avx(auVar1,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = b.u64[3];
  auVar1 = vpmovzxwd_avx(auVar4);
  auVar1 = vpsubd_avx(auVar2,auVar1);
  auVar1 = vpmaxsd_avx(auVar1,(undefined1  [16])0x0);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = a.u64[0];
  auVar3 = vpmovzxwd_avx(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = a.u64[1];
  auVar4 = vpmovzxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = b.u64[0];
  auVar5 = vpmovzxwd_avx(auVar7);
  auVar2 = vpmaxsd_avx(auVar8,(undefined1  [16])0x0);
  auVar5 = vpsubd_avx(auVar3,auVar5);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = b.u64[1];
  auVar3 = vpmovzxwd_avx(auVar8);
  auVar3 = vpsubd_avx(auVar4,auVar3);
  auVar3 = vpmaxsd_avx(auVar3,(undefined1  [16])0x0);
  auVar4 = vpmaxsd_avx(auVar5,(undefined1  [16])0x0);
  auVar10._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar10._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  auVar11._16_16_ = _DAT_00c224e0;
  auVar11._0_16_ = _DAT_00c224e0;
  auVar10 = vpshufb_avx2(auVar10,auVar11);
  auVar12._0_16_ = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar4;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  auVar11 = vpshufb_avx2(auVar12,auVar11);
  auVar10 = vpunpcklqdq_avx2(auVar11,auVar10);
  cVar9 = (c_v256)vpermq_avx2(auVar10,0xd8);
  *in_RDI = cVar9;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_ssub_u16(c_v256 a, c_v256 b) {
  return c_v256_from_v128(c_v128_ssub_u16(a.v128[1], b.v128[1]),
                          c_v128_ssub_u16(a.v128[0], b.v128[0]));
}